

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O0

int uv__idna_toascii_label(char *s,char *se,char **d,char *de)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  uint uVar4;
  int local_68;
  int first;
  uint todo;
  uint delta;
  uint bias;
  uint y;
  uint x;
  uint t;
  uint q;
  uint m;
  uint n;
  uint k;
  uint h;
  uint c;
  char *ss;
  char *de_local;
  char **d_local;
  char *se_local;
  char *s_local;
  
  n = 0;
  local_68 = 0;
  se_local = s;
  while( true ) {
    if (se_local <= se) {
      k = uv__utf8_decode1(&se_local,se);
    }
    if (se < se_local) break;
    if (k < 0x80) {
      n = n + 1;
    }
    else {
      if (k == 0xffffffff) {
        return -0x16;
      }
      local_68 = local_68 + 1;
    }
  }
  if (local_68 != 0) {
    if (*d < de) {
      pcVar2 = *d;
      *d = pcVar2 + 1;
      *pcVar2 = 'x';
    }
    if (*d < de) {
      pcVar2 = *d;
      *d = pcVar2 + 1;
      *pcVar2 = 'n';
    }
    if (*d < de) {
      pcVar2 = *d;
      *d = pcVar2 + 1;
      *pcVar2 = '-';
    }
    if (*d < de) {
      pcVar2 = *d;
      *d = pcVar2 + 1;
      *pcVar2 = '-';
    }
  }
  bias = 0;
  se_local = s;
  do {
    do {
      if (se_local <= se) {
        k = uv__utf8_decode1(&se_local,se);
      }
      if (se < se_local) goto LAB_00124b0c;
    } while (0x7f < k);
    if (*d < de) {
      pcVar2 = *d;
      *d = pcVar2 + 1;
      *pcVar2 = (char)k;
    }
    bias = bias + 1;
  } while (bias != n);
LAB_00124b0c:
  if (local_68 == 0) {
    s_local._4_4_ = n;
  }
  else {
    if ((n != 0) && (*d < de)) {
      pcVar2 = *d;
      *d = pcVar2 + 1;
      *pcVar2 = '-';
    }
    q = 0x80;
    todo = 0x48;
    first = 0;
    bVar3 = true;
    while (local_68 != 0) {
      t = 0xffffffff;
      se_local = s;
      while( true ) {
        if (se_local <= se) {
          k = uv__utf8_decode1(&se_local,se);
        }
        if (se < se_local) break;
        if ((q <= k) && (k < t)) {
          t = k;
        }
      }
      if ((first ^ 0xffffffffU) / (n + 1) < t - q) {
        return -7;
      }
      first = (t - q) * (n + 1) + first;
      se_local = s;
      while( true ) {
        if (se_local <= se) {
          k = uv__utf8_decode1(&se_local,se);
        }
        if (se < se_local) break;
        if ((k < t) && (first = first + 1, first == 0)) {
          return -7;
        }
        if (k == t) {
          m = 0x24;
          x = first;
          while( true ) {
            y = 1;
            if (todo < m) {
              y = m - todo;
            }
            if (0x1a < y) {
              y = 0x1a;
            }
            if (x < y) break;
            uVar4 = x - y;
            x = uVar4 / (0x24 - y);
            if (*d < de) {
              cVar1 = "abcdefghijklmnopqrstuvwxyz0123456789"[y + uVar4 % (0x24 - y)];
              pcVar2 = *d;
              *d = pcVar2 + 1;
              *pcVar2 = cVar1;
            }
            m = m + 0x24;
          }
          if (*d < de) {
            cVar1 = "abcdefghijklmnopqrstuvwxyz0123456789"[x];
            pcVar2 = *d;
            *d = pcVar2 + 1;
            *pcVar2 = cVar1;
          }
          first = (uint)first >> 1;
          if (bVar3) {
            first = (uint)first / 0x15e;
            bVar3 = false;
          }
          n = n + 1;
          todo = 0;
          for (first = (uint)first / n + first; 0x1c7 < (uint)first; first = (uint)first / 0x23) {
            todo = todo + 0x24;
          }
          todo = (uint)(first * 0x24) / (first + 0x26U) + todo;
          first = 0;
          local_68 = local_68 + -1;
        }
      }
      first = first + 1;
      q = t + 1;
    }
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int uv__idna_toascii_label(const char* s, const char* se,
                                  char** d, char* de) {
  static const char alphabet[] = "abcdefghijklmnopqrstuvwxyz0123456789";
  const char* ss;
  unsigned c;
  unsigned h;
  unsigned k;
  unsigned n;
  unsigned m;
  unsigned q;
  unsigned t;
  unsigned x;
  unsigned y;
  unsigned bias;
  unsigned delta;
  unsigned todo;
  int first;

  h = 0;
  ss = s;
  todo = 0;

  foreach_codepoint(c, &s, se) {
    if (c < 128)
      h++;
    else if (c == (unsigned) -1)
      return UV_EINVAL;
    else
      todo++;
  }

  if (todo > 0) {
    if (*d < de) *(*d)++ = 'x';
    if (*d < de) *(*d)++ = 'n';
    if (*d < de) *(*d)++ = '-';
    if (*d < de) *(*d)++ = '-';
  }

  x = 0;
  s = ss;
  foreach_codepoint(c, &s, se) {
    if (c > 127)
      continue;

    if (*d < de)
      *(*d)++ = c;

    if (++x == h)
      break;  /* Visited all ASCII characters. */
  }

  if (todo == 0)
    return h;

  /* Only write separator when we've written ASCII characters first. */
  if (h > 0)
    if (*d < de)
      *(*d)++ = '-';

  n = 128;
  bias = 72;
  delta = 0;
  first = 1;

  while (todo > 0) {
    m = -1;
    s = ss;
    foreach_codepoint(c, &s, se)
      if (c >= n)
        if (c < m)
          m = c;

    x = m - n;
    y = h + 1;

    if (x > ~delta / y)
      return UV_E2BIG;  /* Overflow. */

    delta += x * y;
    n = m;

    s = ss;
    foreach_codepoint(c, &s, se) {
      if (c < n)
        if (++delta == 0)
          return UV_E2BIG;  /* Overflow. */

      if (c != n)
        continue;

      for (k = 36, q = delta; /* empty */; k += 36) {
        t = 1;

        if (k > bias)
          t = k - bias;

        if (t > 26)
          t = 26;

        if (q < t)
          break;

        /* TODO(bnoordhuis) Since 1 <= t <= 26 and therefore
         * 10 <= y <= 35, we can optimize the long division
         * into a table-based reciprocal multiplication.
         */
        x = q - t;
        y = 36 - t;  /* 10 <= y <= 35 since 1 <= t <= 26. */
        q = x / y;
        t = t + x % y;  /* 1 <= t <= 35 because of y. */

        if (*d < de)
          *(*d)++ = alphabet[t];
      }

      if (*d < de)
        *(*d)++ = alphabet[q];

      delta /= 2;

      if (first) {
        delta /= 350;
        first = 0;
      }

      /* No overflow check is needed because |delta| was just
       * divided by 2 and |delta+delta >= delta + delta/h|.
       */
      h++;
      delta += delta / h;

      for (bias = 0; delta > 35 * 26 / 2; bias += 36)
        delta /= 35;

      bias += 36 * delta / (delta + 38);
      delta = 0;
      todo--;
    }

    delta++;
    n++;
  }

  return 0;
}